

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address.c
# Opt level: O2

_Bool fnet_str2addr(char *str,fnet_address_t *addr)

{
  sockaddr *psVar1;
  addrinfo *paVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  sa_family_t sVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  addrinfo *__ai;
  int iVar13;
  size_t sVar14;
  char *pcVar15;
  char *__service;
  char *__dest;
  _Bool _Var16;
  addrinfo **__pai;
  undefined8 uStack_70;
  addrinfo local_68;
  addrinfo *local_38;
  addrinfo *result;
  
  if (addr != (fnet_address_t *)0x0 && str != (char *)0x0) {
    uStack_70 = 0x101308;
    sVar14 = strlen(str);
    if (sVar14 < 0x401) {
      addr->__ss_padding[0x6e] = '\0';
      addr->__ss_padding[0x6f] = '\0';
      addr->__ss_padding[0x70] = '\0';
      addr->__ss_padding[0x71] = '\0';
      addr->__ss_padding[0x72] = '\0';
      addr->__ss_padding[0x73] = '\0';
      addr->__ss_padding[0x74] = '\0';
      addr->__ss_padding[0x75] = '\0';
      addr->__ss_align = 0;
      addr->__ss_padding[0x5e] = '\0';
      addr->__ss_padding[0x5f] = '\0';
      addr->__ss_padding[0x60] = '\0';
      addr->__ss_padding[0x61] = '\0';
      addr->__ss_padding[0x62] = '\0';
      addr->__ss_padding[99] = '\0';
      addr->__ss_padding[100] = '\0';
      addr->__ss_padding[0x65] = '\0';
      addr->__ss_padding[0x66] = '\0';
      addr->__ss_padding[0x67] = '\0';
      addr->__ss_padding[0x68] = '\0';
      addr->__ss_padding[0x69] = '\0';
      addr->__ss_padding[0x6a] = '\0';
      addr->__ss_padding[0x6b] = '\0';
      addr->__ss_padding[0x6c] = '\0';
      addr->__ss_padding[0x6d] = '\0';
      addr->__ss_padding[0x4e] = '\0';
      addr->__ss_padding[0x4f] = '\0';
      addr->__ss_padding[0x50] = '\0';
      addr->__ss_padding[0x51] = '\0';
      addr->__ss_padding[0x52] = '\0';
      addr->__ss_padding[0x53] = '\0';
      addr->__ss_padding[0x54] = '\0';
      addr->__ss_padding[0x55] = '\0';
      addr->__ss_padding[0x56] = '\0';
      addr->__ss_padding[0x57] = '\0';
      addr->__ss_padding[0x58] = '\0';
      addr->__ss_padding[0x59] = '\0';
      addr->__ss_padding[0x5a] = '\0';
      addr->__ss_padding[0x5b] = '\0';
      addr->__ss_padding[0x5c] = '\0';
      addr->__ss_padding[0x5d] = '\0';
      addr->__ss_padding[0x3e] = '\0';
      addr->__ss_padding[0x3f] = '\0';
      addr->__ss_padding[0x40] = '\0';
      addr->__ss_padding[0x41] = '\0';
      addr->__ss_padding[0x42] = '\0';
      addr->__ss_padding[0x43] = '\0';
      addr->__ss_padding[0x44] = '\0';
      addr->__ss_padding[0x45] = '\0';
      addr->__ss_padding[0x46] = '\0';
      addr->__ss_padding[0x47] = '\0';
      addr->__ss_padding[0x48] = '\0';
      addr->__ss_padding[0x49] = '\0';
      addr->__ss_padding[0x4a] = '\0';
      addr->__ss_padding[0x4b] = '\0';
      addr->__ss_padding[0x4c] = '\0';
      addr->__ss_padding[0x4d] = '\0';
      addr->__ss_padding[0x2e] = '\0';
      addr->__ss_padding[0x2f] = '\0';
      addr->__ss_padding[0x30] = '\0';
      addr->__ss_padding[0x31] = '\0';
      addr->__ss_padding[0x32] = '\0';
      addr->__ss_padding[0x33] = '\0';
      addr->__ss_padding[0x34] = '\0';
      addr->__ss_padding[0x35] = '\0';
      addr->__ss_padding[0x36] = '\0';
      addr->__ss_padding[0x37] = '\0';
      addr->__ss_padding[0x38] = '\0';
      addr->__ss_padding[0x39] = '\0';
      addr->__ss_padding[0x3a] = '\0';
      addr->__ss_padding[0x3b] = '\0';
      addr->__ss_padding[0x3c] = '\0';
      addr->__ss_padding[0x3d] = '\0';
      addr->__ss_padding[0x1e] = '\0';
      addr->__ss_padding[0x1f] = '\0';
      addr->__ss_padding[0x20] = '\0';
      addr->__ss_padding[0x21] = '\0';
      addr->__ss_padding[0x22] = '\0';
      addr->__ss_padding[0x23] = '\0';
      addr->__ss_padding[0x24] = '\0';
      addr->__ss_padding[0x25] = '\0';
      addr->__ss_padding[0x26] = '\0';
      addr->__ss_padding[0x27] = '\0';
      addr->__ss_padding[0x28] = '\0';
      addr->__ss_padding[0x29] = '\0';
      addr->__ss_padding[0x2a] = '\0';
      addr->__ss_padding[0x2b] = '\0';
      addr->__ss_padding[0x2c] = '\0';
      addr->__ss_padding[0x2d] = '\0';
      addr->__ss_padding[0xe] = '\0';
      addr->__ss_padding[0xf] = '\0';
      addr->__ss_padding[0x10] = '\0';
      addr->__ss_padding[0x11] = '\0';
      addr->__ss_padding[0x12] = '\0';
      addr->__ss_padding[0x13] = '\0';
      addr->__ss_padding[0x14] = '\0';
      addr->__ss_padding[0x15] = '\0';
      addr->__ss_padding[0x16] = '\0';
      addr->__ss_padding[0x17] = '\0';
      addr->__ss_padding[0x18] = '\0';
      addr->__ss_padding[0x19] = '\0';
      addr->__ss_padding[0x1a] = '\0';
      addr->__ss_padding[0x1b] = '\0';
      addr->__ss_padding[0x1c] = '\0';
      addr->__ss_padding[0x1d] = '\0';
      addr->ss_family = 0;
      addr->__ss_padding[0] = '\0';
      addr->__ss_padding[1] = '\0';
      addr->__ss_padding[2] = '\0';
      addr->__ss_padding[3] = '\0';
      addr->__ss_padding[4] = '\0';
      addr->__ss_padding[5] = '\0';
      addr->__ss_padding[6] = '\0';
      addr->__ss_padding[7] = '\0';
      addr->__ss_padding[8] = '\0';
      addr->__ss_padding[9] = '\0';
      addr->__ss_padding[10] = '\0';
      addr->__ss_padding[0xb] = '\0';
      addr->__ss_padding[0xc] = '\0';
      addr->__ss_padding[0xd] = '\0';
      lVar4 = -(sVar14 + 0x10 & 0xfffffffffffffff0);
      __dest = (char *)((long)&local_68 + lVar4);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10135d;
      strncpy(__dest,str,sVar14 + 1);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x3a;
      uVar3 = *(undefined8 *)((long)&uStack_70 + lVar4);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x101368;
      pcVar15 = strrchr(__dest,(int)uVar3);
      if (pcVar15 == (char *)0x0) {
        __service = (char *)0x0;
      }
      else {
        __service = pcVar15 + 1;
        *pcVar15 = '\0';
      }
      __pai = &local_38;
      local_38 = (addrinfo *)0x0;
      local_68.ai_flags = 0;
      local_68.ai_family = 0;
      local_68.ai_canonname = (char *)0x0;
      local_68.ai_next = (addrinfo *)0x0;
      local_68.ai_addrlen = 0;
      local_68._20_4_ = 0;
      local_68.ai_addr = (sockaddr *)0x0;
      local_68.ai_socktype = 1;
      local_68.ai_protocol = 6;
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1013ad;
      iVar13 = getaddrinfo(__dest,__service,&local_68,__pai);
      __ai = local_38;
      _Var16 = false;
      if (iVar13 != 0) {
        return false;
      }
      do {
        paVar2 = *__pai;
        if (paVar2 == (addrinfo *)0x0) {
LAB_001013fa:
          *(undefined8 *)((long)&uStack_70 + lVar4) = 0x101403;
          freeaddrinfo(__ai);
          return _Var16;
        }
        if (paVar2->ai_family == 2) {
          psVar1 = paVar2->ai_addr;
          cVar7 = psVar1->sa_data[0];
          cVar8 = psVar1->sa_data[1];
          cVar9 = psVar1->sa_data[2];
          cVar10 = psVar1->sa_data[3];
          cVar11 = psVar1->sa_data[4];
          cVar12 = psVar1->sa_data[5];
          uVar3 = *(undefined8 *)(psVar1->sa_data + 6);
          addr->ss_family = psVar1->sa_family;
          addr->__ss_padding[0] = cVar7;
          addr->__ss_padding[1] = cVar8;
          addr->__ss_padding[2] = cVar9;
          addr->__ss_padding[3] = cVar10;
          addr->__ss_padding[4] = cVar11;
          addr->__ss_padding[5] = cVar12;
          *(undefined8 *)(addr->__ss_padding + 6) = uVar3;
          _Var16 = true;
          goto LAB_001013fa;
        }
        if ((paVar2->ai_family == 10) && (addr->ss_family == 0)) {
          psVar1 = paVar2->ai_addr;
          sVar6 = psVar1->sa_family;
          cVar7 = psVar1->sa_data[0];
          cVar8 = psVar1->sa_data[1];
          cVar9 = psVar1->sa_data[2];
          cVar10 = psVar1->sa_data[3];
          cVar11 = psVar1->sa_data[4];
          cVar12 = psVar1->sa_data[5];
          uVar3 = *(undefined8 *)(psVar1->sa_data + 6);
          uVar5 = *(undefined8 *)(psVar1[1].sa_data + 2);
          *(undefined8 *)(addr->__ss_padding + 10) = *(undefined8 *)(psVar1->sa_data + 10);
          *(undefined8 *)(addr->__ss_padding + 0x12) = uVar5;
          addr->ss_family = sVar6;
          addr->__ss_padding[0] = cVar7;
          addr->__ss_padding[1] = cVar8;
          addr->__ss_padding[2] = cVar9;
          addr->__ss_padding[3] = cVar10;
          addr->__ss_padding[4] = cVar11;
          addr->__ss_padding[5] = cVar12;
          *(undefined8 *)(addr->__ss_padding + 6) = uVar3;
          _Var16 = true;
        }
        __pai = &paVar2->ai_next;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool fnet_str2addr(char const *str, fnet_address_t *addr)
{
    if (!str || !addr)
    {
        FLOG_ERR("Invalid argument");
        return false;
    }

    size_t const len = strlen(str);
    if (len > FMAX_ADDR)
    {
        FLOG_ERR("Address length is too long");
        return false;
    }

    memset(addr, 0, sizeof *addr);

    char host[len + 1];
    strncpy(host, str, len + 1);

    char *port = strrchr(host, ':');
    if (port) *(port++) = 0;

    struct addrinfo *result = 0;
    struct addrinfo hints = { 0 };
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_protocol = IPPROTO_TCP;

    if (getaddrinfo(host, port, &hints, &result))
    {
        FLOG_ERR("getaddrinfo failed");
        return false;
    }

    bool ret = false;

    for(struct addrinfo *ptr = result; ptr; ptr = ptr->ai_next)
    {
        if (ptr->ai_family == AF_INET)
        {
            struct sockaddr_in *src_addr = (struct sockaddr_in*)ptr->ai_addr;
            struct sockaddr_in *dst_addr = (struct sockaddr_in*)addr;
            memcpy(dst_addr, src_addr, sizeof *src_addr);
            ret = true;
            break;
        }
        else if (!addr->ss_family && ptr->ai_family == AF_INET6)
        {
            struct sockaddr_in6 *src_addr = (struct sockaddr_in6*)ptr->ai_addr;
            struct sockaddr_in6 *dst_addr = (struct sockaddr_in6*)addr;
            memcpy(dst_addr, src_addr, sizeof *src_addr);
            ret = true;
        }
    }

    freeaddrinfo(result);

    return ret;
}